

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O2

bool bssl::tls_add_message(SSL *ssl,Array<unsigned_char> *msg)

{
  SSL3_STATE *pSVar1;
  SSL_HANDSHAKE *pSVar2;
  Span<const_unsigned_char> *pSVar3;
  bool bVar4;
  int iVar5;
  buf_mem_st *pbVar6;
  BUF_MEM *__p;
  size_t in_R8;
  size_t in_R9;
  Span<const_unsigned_char> SVar8;
  Span<const_unsigned_char> SVar9;
  Array<unsigned_char> local_48;
  Span<const_unsigned_char> *local_38;
  size_t sVar7;
  
  local_48 = *msg;
  local_38 = (Span<const_unsigned_char> *)msg;
  iVar5 = SSL_is_quic(ssl);
  if ((iVar5 == 0) &&
     (((ssl->s3->aead_write_ctx)._M_t.
       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
      (SSL_CIPHER *)0x0)) {
    while (local_48.size_ != 0) {
      SVar9 = Span<const_unsigned_char>::subspan
                        ((Span<const_unsigned_char> *)&local_48,0,(ulong)ssl->max_send_fragment);
      local_48 = (Array<unsigned_char>)
                 Span<const_unsigned_char>::subspan
                           ((Span<const_unsigned_char> *)&local_48,SVar9.size_,0xffffffffffffffff);
      SVar8.size_ = in_R8;
      SVar8.data_ = (uchar *)SVar9.size_;
      bVar4 = add_record_to_flight((bssl *)ssl,(SSL *)0x16,(uint8_t)SVar9.data_,SVar8);
      if (!bVar4) {
        return false;
      }
    }
LAB_0021d597:
    pSVar3 = local_38;
    SVar9.size_ = in_R9;
    SVar9.data_ = (uchar *)local_38->size_;
    ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x16,(int)local_38->data_,SVar9);
    pSVar2 = (ssl->s3->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
    if ((pSVar2 == (SSL_HANDSHAKE *)0x0) ||
       (bVar4 = SSLTranscript::Update(&pSVar2->transcript,*pSVar3), bVar4)) {
      return true;
    }
  }
  else {
    do {
      if (local_48.size_ == 0) goto LAB_0021d597;
      pbVar6 = (ssl->s3->pending_hs_data)._M_t.
               super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
      if (pbVar6 == (buf_mem_st *)0x0) {
LAB_0021d4b7:
        sVar7 = 0;
      }
      else {
        if ((ulong)ssl->max_send_fragment <= pbVar6->length) {
          bVar4 = tls_flush_pending_hs_data(ssl);
          if (!bVar4) {
            return false;
          }
          pbVar6 = (ssl->s3->pending_hs_data)._M_t.
                   super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
          if (pbVar6 == (buf_mem_st *)0x0) goto LAB_0021d4b7;
        }
        sVar7 = pbVar6->length;
      }
      SVar8 = Span<const_unsigned_char>::subspan
                        ((Span<const_unsigned_char> *)&local_48,0,ssl->max_send_fragment - sVar7);
      sVar7 = SVar8.size_;
      if (sVar7 == 0) {
        __assert_fail("!chunk.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                      ,0x7a,"bool bssl::tls_add_message(SSL *, Array<uint8_t>)");
      }
      local_48 = (Array<unsigned_char>)
                 Span<const_unsigned_char>::subspan
                           ((Span<const_unsigned_char> *)&local_48,sVar7,0xffffffffffffffff);
      pSVar1 = ssl->s3;
      pbVar6 = (pSVar1->pending_hs_data)._M_t.
               super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
      if (pbVar6 == (buf_mem_st *)0x0) {
        __p = BUF_MEM_new();
        std::__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter> *)&pSVar1->pending_hs_data,
                   (pointer)__p);
        pbVar6 = (ssl->s3->pending_hs_data)._M_t.
                 super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
        if (pbVar6 == (buf_mem_st *)0x0) {
          return false;
        }
      }
      iVar5 = BUF_MEM_append(pbVar6,SVar8.data_,sVar7);
    } while (iVar5 != 0);
  }
  return false;
}

Assistant:

bool tls_add_message(SSL *ssl, Array<uint8_t> msg) {
  // Pack handshake data into the minimal number of records. This avoids
  // unnecessary encryption overhead, notably in TLS 1.3 where we send several
  // encrypted messages in a row. For now, we do not do this for the null
  // cipher. The benefit is smaller and there is a risk of breaking buggy
  // implementations.
  //
  // TODO(crbug.com/374991962): See if we can do this uniformly.
  Span<const uint8_t> rest = msg;
  if (!SSL_is_quic(ssl) && ssl->s3->aead_write_ctx->is_null_cipher()) {
    while (!rest.empty()) {
      Span<const uint8_t> chunk = rest.subspan(0, ssl->max_send_fragment);
      rest = rest.subspan(chunk.size());

      if (!add_record_to_flight(ssl, SSL3_RT_HANDSHAKE, chunk)) {
        return false;
      }
    }
  } else {
    while (!rest.empty()) {
      // Flush if |pending_hs_data| is full.
      if (ssl->s3->pending_hs_data &&
          ssl->s3->pending_hs_data->length >= ssl->max_send_fragment &&
          !tls_flush_pending_hs_data(ssl)) {
        return false;
      }

      size_t pending_len =
          ssl->s3->pending_hs_data ? ssl->s3->pending_hs_data->length : 0;
      Span<const uint8_t> chunk =
          rest.subspan(0, ssl->max_send_fragment - pending_len);
      assert(!chunk.empty());
      rest = rest.subspan(chunk.size());

      if (!ssl->s3->pending_hs_data) {
        ssl->s3->pending_hs_data.reset(BUF_MEM_new());
      }
      if (!ssl->s3->pending_hs_data ||
          !BUF_MEM_append(ssl->s3->pending_hs_data.get(), chunk.data(),
                          chunk.size())) {
        return false;
      }
    }
  }

  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_HANDSHAKE, msg);
  // TODO(svaldez): Move this up a layer to fix abstraction for SSLTranscript on
  // hs.
  if (ssl->s3->hs != NULL &&  //
      !ssl->s3->hs->transcript.Update(msg)) {
    return false;
  }
  return true;
}